

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_iterator.hpp
# Opt level: O0

void __thiscall
boost::iterators::
filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::filter_iterator(filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *this,filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        f,weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *x,
                 weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *end_)

{
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  
  iterator_adaptor<boost::iterators::filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>
  ::iterator_adaptor((iterator_adaptor<boost::iterators::filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>
                      *)in_RDX,in_stack_ffffffffffffffa8);
  *(undefined8 *)(in_RDI + 0x20) = in_RSI;
  this_00 = (filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)(in_RDI + 0x28);
  xpressive::detail::
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::weak_iterator(in_RDX,in_stack_ffffffffffffffa8);
  satisfy_predicate(this_00);
  return;
}

Assistant:

filter_iterator(Predicate f, Iterator x, Iterator end_ = Iterator())
          : super_t(BOOST_ITERATOR_DETAIL_MOVE(Iterator, x)), m_predicate(BOOST_ITERATOR_DETAIL_MOVE(Predicate, f)), m_end(BOOST_ITERATOR_DETAIL_MOVE(Iterator, end_))
      {
          satisfy_predicate();
      }